

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O0

bool ProcessMantissaDigit(char ch,int64_t *mantissa,int *mantissa_tzeros)

{
  long lVar1;
  int *in_RDX;
  long *in_RSI;
  char in_DIL;
  long in_FS_OFFSET;
  int i;
  undefined4 local_24;
  undefined1 local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_DIL == '0') {
    *in_RDX = *in_RDX + 1;
  }
  else {
    for (local_24 = 0; local_24 <= *in_RDX; local_24 = local_24 + 1) {
      if (99999999999999999 < *in_RSI) {
        local_9 = false;
        goto LAB_00fa71ba;
      }
      *in_RSI = *in_RSI * 10;
    }
    *in_RSI = (long)(in_DIL + -0x30) + *in_RSI;
    *in_RDX = 0;
  }
  local_9 = true;
LAB_00fa71ba:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

static inline bool ProcessMantissaDigit(char ch, int64_t &mantissa, int &mantissa_tzeros)
{
    if(ch == '0')
        ++mantissa_tzeros;
    else {
        for (int i=0; i<=mantissa_tzeros; ++i) {
            if (mantissa > (UPPER_BOUND / 10LL))
                return false; /* overflow */
            mantissa *= 10;
        }
        mantissa += ch - '0';
        mantissa_tzeros = 0;
    }
    return true;
}